

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.c
# Opt level: O3

void av1_lowbd_fwd_txfm2d_16x4_sse2
               (int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  short *psVar1;
  byte bVar2;
  code *pcVar3;
  undefined8 uVar4;
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  int8_t *piVar8;
  bool bVar9;
  int16_t *piVar10;
  uint uVar11;
  undefined7 in_register_00000009;
  long lVar12;
  undefined8 *puVar13;
  long lVar14;
  ulong uVar15;
  bool bVar16;
  undefined8 *puVar17;
  undefined4 uVar18;
  undefined1 auVar21 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined4 uVar28;
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  __m128i buf0 [16];
  __m128i buf1 [16];
  code *local_248;
  int16_t *local_240;
  undefined8 local_238 [2];
  undefined2 local_228;
  undefined2 uStack_226;
  undefined2 uStack_224;
  undefined2 uStack_222;
  undefined2 uStack_220;
  undefined2 uStack_21e;
  undefined2 uStack_21c;
  undefined2 uStack_21a;
  undefined1 local_218 [16];
  undefined2 local_208;
  undefined2 uStack_206;
  undefined2 uStack_204;
  undefined2 uStack_202;
  undefined2 uStack_200;
  undefined2 uStack_1fe;
  undefined2 uStack_1fc;
  undefined2 uStack_1fa;
  undefined8 local_138 [6];
  undefined1 auStack_108 [16];
  undefined8 auStack_f8 [6];
  undefined1 auStack_c8 [152];
  undefined1 auVar19 [12];
  undefined1 auVar24 [16];
  undefined1 auVar20 [16];
  undefined1 auVar25 [16];
  undefined1 auVar29 [12];
  undefined1 auVar31 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  
  piVar8 = av1_fwd_txfm_shift_ls[0xe];
  uVar15 = (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_type) << 3);
  local_248 = *(code **)((long)col_txfm8x4_arr + uVar15);
  pcVar3 = *(code **)((long)row_txfm8x16_arr + uVar15);
  lVar14 = 0;
  puVar17 = local_238;
  bVar9 = true;
  local_240 = input;
  do {
    bVar16 = bVar9;
    piVar10 = local_240 + lVar14 * 8;
    if ((0xbeafU >> (tx_type & 0x1f) & 1) == 0 && tx_type < 0x10) {
      lVar12 = 0x40;
      do {
        uVar4 = *(undefined8 *)(piVar10 + 4);
        *(undefined8 *)((long)&local_248 + lVar12) = *(undefined8 *)piVar10;
        *(undefined8 *)((long)&local_240 + lVar12) = uVar4;
        piVar10 = piVar10 + stride;
        lVar12 = lVar12 + -0x10;
      } while (lVar12 != 0);
    }
    else {
      lVar12 = 0;
      do {
        uVar4 = *(undefined8 *)(piVar10 + 4);
        *(undefined8 *)((long)local_238 + lVar12) = *(undefined8 *)piVar10;
        *(undefined8 *)((long)local_238 + lVar12 + 8) = uVar4;
        lVar12 = lVar12 + 0x10;
        piVar10 = piVar10 + stride;
      } while (lVar12 != 0x40);
    }
    bVar2 = *piVar8;
    uVar11 = (uint)(char)bVar2;
    if ((int)uVar11 < 0) {
      auVar26 = ZEXT416((uint)(1 << (~bVar2 & 0x1f)));
      auVar26 = pshuflw(auVar26,auVar26,0);
      auVar26._4_4_ = auVar26._0_4_;
      auVar26._8_4_ = auVar26._0_4_;
      auVar26._12_4_ = auVar26._0_4_;
      lVar12 = 0;
      do {
        auVar30 = paddsw(*(undefined1 (*) [16])((long)local_238 + lVar12),auVar26);
        auVar30 = psraw(auVar30,ZEXT416(-uVar11));
        *(undefined1 (*) [16])((long)local_238 + lVar12) = auVar30;
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x40);
    }
    else if (bVar2 != 0) {
      lVar12 = 0;
      do {
        auVar26 = psllw(*(undefined1 (*) [16])((long)local_238 + lVar12),ZEXT416(uVar11));
        *(undefined1 (*) [16])((long)local_238 + lVar12) = auVar26;
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x40);
    }
    (*local_248)(puVar17,puVar17,0xd);
    bVar2 = piVar8[1];
    uVar11 = (uint)(char)bVar2;
    if ((int)uVar11 < 0) {
      auVar26 = ZEXT416((uint)(1 << (~bVar2 & 0x1f)));
      auVar26 = pshuflw(auVar26,auVar26,0);
      auVar30._0_4_ = auVar26._0_4_;
      auVar30._4_4_ = auVar30._0_4_;
      auVar30._8_4_ = auVar30._0_4_;
      auVar30._12_4_ = auVar30._0_4_;
      lVar12 = 0;
      do {
        auVar26 = paddsw(*(undefined1 (*) [16])((long)local_238 + lVar12),auVar30);
        auVar26 = psraw(auVar26,ZEXT416(-uVar11));
        *(undefined1 (*) [16])((long)local_238 + lVar12) = auVar26;
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x40);
    }
    else if (bVar2 != 0) {
      lVar12 = 0;
      do {
        auVar26 = psllw(*(undefined1 (*) [16])((long)local_238 + lVar12),ZEXT416(uVar11));
        *(undefined1 (*) [16])((long)local_238 + lVar12) = auVar26;
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x40);
    }
    lVar12 = lVar14 * 0x80;
    auVar36._0_12_ = local_238._0_12_;
    auVar36._12_2_ = local_238[0]._6_2_;
    auVar36._14_2_ = uStack_222;
    auVar35._12_4_ = auVar36._12_4_;
    auVar35._0_10_ = local_238._0_10_;
    auVar35._10_2_ = uStack_224;
    auVar34._10_6_ = auVar35._10_6_;
    auVar34._0_8_ = local_238[0];
    auVar34._8_2_ = local_238[0]._4_2_;
    auVar5._4_8_ = auVar34._8_8_;
    auVar5._2_2_ = uStack_226;
    auVar5._0_2_ = local_238[0]._2_2_;
    auVar33._0_4_ = CONCAT22(local_228,(short)local_238[0]);
    auVar33._4_12_ = auVar5;
    auVar40._0_12_ = local_218._0_12_;
    auVar40._12_2_ = local_218._6_2_;
    auVar40._14_2_ = uStack_202;
    auVar39._12_4_ = auVar40._12_4_;
    auVar39._0_10_ = local_218._0_10_;
    auVar39._10_2_ = uStack_204;
    auVar38._10_6_ = auVar39._10_6_;
    auVar38._0_8_ = local_218._0_8_;
    auVar38._8_2_ = local_218._4_2_;
    auVar6._4_8_ = auVar38._8_8_;
    auVar6._2_2_ = uStack_206;
    auVar6._0_2_ = local_218._2_2_;
    uVar18 = CONCAT22(uStack_220,(short)local_238[1]);
    auVar19._0_8_ = CONCAT26(uStack_21e,CONCAT24(local_238[1]._2_2_,uVar18));
    auVar19._8_2_ = local_238[1]._4_2_;
    auVar19._10_2_ = uStack_21c;
    auVar20._12_2_ = local_238[1]._6_2_;
    auVar20._0_12_ = auVar19;
    auVar20._14_2_ = uStack_21a;
    uVar28 = CONCAT22(uStack_200,local_218._8_2_);
    auVar29._0_8_ = CONCAT26(uStack_1fe,CONCAT24(local_218._10_2_,uVar28));
    auVar29._8_2_ = local_218._12_2_;
    auVar29._10_2_ = uStack_1fc;
    auVar31._12_2_ = local_218._14_2_;
    auVar31._0_12_ = auVar29;
    auVar31._14_2_ = uStack_1fa;
    auVar27._0_8_ = auVar33._0_8_;
    auVar27._8_4_ = auVar5._0_4_;
    auVar27._12_4_ = auVar6._0_4_;
    auVar32._8_4_ = (int)((ulong)auVar19._0_8_ >> 0x20);
    auVar32._0_8_ = auVar19._0_8_;
    auVar32._12_4_ = (int)((ulong)auVar29._0_8_ >> 0x20);
    auVar37._0_8_ = CONCAT44(auVar38._8_4_,auVar34._8_4_);
    auVar37._8_4_ = auVar35._12_4_;
    auVar37._12_4_ = auVar39._12_4_;
    auVar21._0_8_ = CONCAT44(auVar29._8_4_,auVar19._8_4_);
    auVar21._8_4_ = auVar20._12_4_;
    auVar21._12_4_ = auVar31._12_4_;
    local_138[lVar14 * 0x10] = CONCAT44(CONCAT22(local_208,local_218._0_2_),auVar33._0_4_);
    local_138[lVar14 * 0x10 + 1] = 0;
    local_138[lVar14 * 0x10 + 2] = auVar27._8_8_;
    local_138[lVar14 * 0x10 + 3] = 0;
    *(undefined8 *)(auStack_108 + lVar12 + -0x10) = auVar37._0_8_;
    *(undefined8 *)(auStack_108 + lVar12 + -8) = 0;
    *(undefined1 (*) [16])(auStack_108 + lVar12) = auVar37 >> 0x40;
    auStack_f8[lVar14 * 0x10] = CONCAT44(uVar28,uVar18);
    auStack_f8[lVar14 * 0x10 + 1] = 0;
    auStack_f8[lVar14 * 0x10 + 2] = auVar32._8_8_;
    auStack_f8[lVar14 * 0x10 + 3] = 0;
    *(undefined8 *)(auStack_c8 + lVar12 + -0x10) = auVar21._0_8_;
    *(undefined8 *)(auStack_c8 + lVar12 + -8) = 0;
    *(undefined1 (*) [16])(auStack_c8 + lVar12) = auVar21 >> 0x40;
    lVar14 = 1;
    bVar9 = false;
  } while (bVar16);
  if ((0x7f1fU >> (tx_type & 0x1f) & 1) == 0 && tx_type < 0x10) {
    lVar14 = 0x100;
    puVar13 = local_138;
    do {
      uVar4 = puVar13[1];
      *(undefined8 *)((long)&local_248 + lVar14) = *puVar13;
      *(undefined8 *)((long)&local_240 + lVar14) = uVar4;
      puVar13 = puVar13 + 2;
      lVar14 = lVar14 + -0x10;
    } while (lVar14 != 0);
  }
  else {
    puVar17 = local_138;
  }
  auVar22._0_8_ = (*pcVar3)(puVar17,puVar17,0xd);
  auVar22._8_8_ = extraout_XMM0_Qb;
  bVar2 = piVar8[2];
  if ((char)bVar2 < '\0') {
    auVar26 = ZEXT416((uint)(1 << (~bVar2 & 0x1f)));
    auVar26 = pshuflw(auVar26,auVar26,0);
    auVar22._0_4_ = auVar26._0_4_;
    auVar22._4_4_ = auVar22._0_4_;
    auVar22._8_4_ = auVar22._0_4_;
    auVar22._12_4_ = auVar22._0_4_;
    lVar14 = 0;
    do {
      auVar26 = paddsw(*(undefined1 (*) [16])((long)puVar17 + lVar14),auVar22);
      auVar26 = psraw(auVar26,ZEXT416((uint)-(int)(char)bVar2));
      *(undefined1 (*) [16])((long)puVar17 + lVar14) = auVar26;
      lVar14 = lVar14 + 0x10;
    } while (lVar14 != 0x100);
  }
  else if (bVar2 != 0) {
    lVar14 = 0;
    auVar22 = ZEXT416((uint)(int)(char)bVar2);
    do {
      auVar26 = psllw(*(undefined1 (*) [16])((long)puVar17 + lVar14),auVar22);
      *(undefined1 (*) [16])((long)puVar17 + lVar14) = auVar26;
      lVar14 = lVar14 + 0x10;
    } while (lVar14 != 0x100);
  }
  lVar14 = 0;
  do {
    psVar1 = (short *)((long)puVar17 + lVar14);
    auVar25._0_12_ = auVar22._0_12_;
    auVar25._12_2_ = auVar22._6_2_;
    auVar25._14_2_ = psVar1[3];
    auVar24._12_4_ = auVar25._12_4_;
    auVar24._0_10_ = auVar22._0_10_;
    auVar24._10_2_ = psVar1[2];
    auVar23._10_6_ = auVar24._10_6_;
    auVar23._0_8_ = auVar22._0_8_;
    auVar23._8_2_ = auVar22._4_2_;
    auVar7._4_8_ = auVar23._8_8_;
    auVar7._2_2_ = psVar1[1];
    auVar7._0_2_ = auVar22._2_2_;
    auVar22._0_4_ = (int)*psVar1;
    auVar22._4_4_ = auVar7._0_4_ >> 0x10;
    auVar22._8_4_ = auVar23._8_4_ >> 0x10;
    auVar22._12_4_ = auVar24._12_4_ >> 0x10;
    *(undefined1 (*) [16])((long)output + lVar14) = auVar22;
    lVar14 = lVar14 + 0x10;
  } while (lVar14 != 0x100);
  return;
}

Assistant:

void av1_lowbd_fwd_txfm2d_16x4_sse2(const int16_t *input, int32_t *output,
                                    int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  __m128i buf0[16], buf1[16];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_16X4];
  const int txw_idx = get_txw_idx(TX_16X4);
  const int txh_idx = get_txh_idx(TX_16X4);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = 16;
  const int height = 4;
  const transform_1d_sse2 col_txfm = col_txfm8x4_arr[tx_type];
  const transform_1d_sse2 row_txfm = row_txfm8x16_arr[tx_type];
  __m128i *buf;
  int ud_flip, lr_flip;

  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  for (int i = 0; i < 2; i++) {
    if (ud_flip) {
      load_buffer_16bit_to_16bit_flip(input + 8 * i, stride, buf0, height);
    } else {
      load_buffer_16bit_to_16bit(input + 8 * i, stride, buf0, height);
    }
    round_shift_16bit(buf0, height, shift[0]);
    col_txfm(buf0, buf0, cos_bit_col);
    round_shift_16bit(buf0, height, shift[1]);
    transpose_16bit_8x4(buf0, buf1 + 8 * i);
  }

  if (lr_flip) {
    buf = buf0;
    flip_buf_sse2(buf1, buf, width);
  } else {
    buf = buf1;
  }
  row_txfm(buf, buf, cos_bit_row);
  round_shift_16bit(buf, width, shift[2]);
  store_buffer_16bit_to_32bit_w4(buf, output, height, width);
}